

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

Id dxil_spv::make_fp8_type(Impl *impl)

{
  Id IVar1;
  Builder *pBVar2;
  
  pBVar2 = Converter::Impl::builder(impl);
  spv::Builder::addCapability(pBVar2,CapabilityInt8);
  pBVar2 = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintType(pBVar2,8);
  return IVar1;
}

Assistant:

static spv::Id make_fp8_type(Converter::Impl &impl)
{
#if WMMA_FP8
	// Doesn't exist in SPIR-V yet. But if a driver magically understands it ... *shrug*
	return impl.builder().makeFloatType(8);
#else
	impl.builder().addCapability(spv::CapabilityInt8);
	return impl.builder().makeUintType(8);
#endif
}